

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O2

string * __thiscall MlmWrap::getID_abi_cxx11_(string *__return_storage_ptr__,MlmWrap *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->id);
  return __return_storage_ptr__;
}

Assistant:

std::string MlmWrap::getID() const{
    return id;
}